

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::ComputeMulRange::operator()
          (ComputeMulRange *this,Random *rnd,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  int local_64;
  int i;
  float subRangeLen;
  float scaledMax;
  float scaledMin;
  float scale;
  float scaleStep;
  float subRangeStep;
  float maxScale;
  float minScale;
  float *bMax_local;
  float *bMin_local;
  float *aMax_local;
  float *aMin_local;
  float dstMax_local;
  float dstMin_local;
  Random *rnd_local;
  ComputeMulRange *this_local;
  
  subRangeStep = 0.25;
  scaleStep = 2.0;
  scale = 0.25;
  scaledMin = 0.25;
  _maxScale = bMax;
  bMax_local = bMin;
  bMin_local = aMax;
  aMax_local = aMin;
  aMin_local._0_4_ = dstMax;
  aMin_local._4_4_ = dstMin;
  _dstMax_local = rnd;
  rnd_local = (Random *)this;
  scaledMax = getQuantizedFloat(rnd,0.25,2.0,0.25);
  subRangeLen = aMin_local._4_4_ / scaledMax;
  i = (int)(aMin_local._0_4_ / scaledMax);
  bVar2 = quantizeFloatRange(&subRangeLen,(float *)&i);
  if (!bVar2) {
    scaledMax = 1.0;
    subRangeLen = aMin_local._4_4_;
    i = (int)aMin_local._0_4_;
  }
  fVar3 = getQuantizedFloat(_dstMax_local,0.0,(float)i - subRangeLen,0.25);
  fVar1 = subRangeLen;
  fVar4 = getQuantizedFloat(_dstMax_local,0.0,((float)i - subRangeLen) - fVar3,0.25);
  *aMax_local = fVar1 + fVar4;
  *bMin_local = *aMax_local + fVar3;
  *bMax_local = scaledMax;
  *_maxScale = scaledMax;
  for (local_64 = 0; local_64 < 5; local_64 = local_64 + 1) {
    bVar2 = de::inBounds<float>(*aMax_local * (-(float)local_64 * 0.25 + scaledMax),aMin_local._4_4_
                                ,aMin_local._0_4_);
    if ((bVar2) &&
       (bVar2 = de::inBounds<float>(*bMin_local * (-(float)local_64 * 0.25 + scaledMax),
                                    aMin_local._4_4_,aMin_local._0_4_), bVar2)) {
      *bMax_local = -(float)local_64 * 0.25 + scaledMax;
    }
    bVar2 = de::inBounds<float>(*aMax_local * ((float)local_64 * 0.25 + scaledMax),aMin_local._4_4_,
                                aMin_local._0_4_);
    if ((bVar2) &&
       (bVar2 = de::inBounds<float>(*bMin_local * ((float)local_64 * 0.25 + scaledMax),
                                    aMin_local._4_4_,aMin_local._0_4_), bVar2)) {
      *_maxScale = (float)local_64 * 0.25 + scaledMax;
    }
  }
  bVar2 = de::Random::getBool(_dstMax_local);
  if (bVar2) {
    std::swap<float>(aMax_local,bMin_local);
    std::swap<float>(bMax_local,_maxScale);
    *aMax_local = *aMax_local * -1.0;
    *bMin_local = *bMin_local * -1.0;
    *bMax_local = *bMax_local * -1.0;
    *_maxScale = *_maxScale * -1.0;
  }
  return;
}

Assistant:

void ComputeMulRange::operator() (de::Random& rnd, float dstMin, float dstMax, float& aMin, float& aMax, float& bMin, float& bMax) const
{
	const float minScale	 = 0.25f;
	const float maxScale	 = 2.0f;
	const float subRangeStep = 0.25f;
	const float scaleStep	 = 0.25f;

	float scale		= getQuantizedFloat(rnd, minScale, maxScale, scaleStep);
	float scaledMin	= dstMin/scale;
	float scaledMax	= dstMax/scale;

	// Quantize scaled value range if possible
	if (!quantizeFloatRange(scaledMin, scaledMax))
	{
		// Fall back to 1.0 as a scale
		scale		= 1.0f;
		scaledMin	= dstMin;
		scaledMax	= dstMax;
	}

	float subRangeLen = getQuantizedFloat(rnd, 0.0f, scaledMax-scaledMin, subRangeStep);
	aMin = scaledMin + getQuantizedFloat(rnd, 0.0f, (scaledMax-scaledMin)-subRangeLen, subRangeStep);
	aMax = aMin + subRangeLen;

	// Find scale range
	bMin = scale;
	bMax = scale;
	for (int i = 0; i < 5; i++)
	{
		if (de::inBounds(aMin*(scale-(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale-(float)i*scaleStep), dstMin, dstMax))
			bMin = scale-(float)i*scaleStep;

		if (de::inBounds(aMin*(scale+(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale+(float)i*scaleStep), dstMin, dstMax))
			bMax = scale+(float)i*scaleStep;
	}

	// Negative scale?
	if (rnd.getBool())
	{
		std::swap(aMin, aMax);
		std::swap(bMin, bMax);
		aMin	*= -1.0f;
		aMax	*= -1.0f;
		bMin	*= -1.0f;
		bMax	*= -1.0f;
	}

#if defined(DE_DEBUG)
	const float eps = 0.001f;
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin*bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMax, dstMin-eps, dstMax+eps));
#endif
}